

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  limb_span y;
  bool bVar1;
  uint in_ESI;
  limb max_native;
  uint32_t small_step;
  limb_span large;
  size_t large_length;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar2;
  size_t in_stack_ffffffffffffffc8;
  stackvec<(unsigned_short)62> *in_stack_ffffffffffffffd0;
  size_t local_28;
  uint local_14;
  bool local_1;
  
  span<unsigned_long>::span
            ((span<unsigned_long> *)&stack0xffffffffffffffd0,pow5::large_power_of_5,5);
  for (local_14 = in_ESI; 0x86 < local_14; local_14 = local_14 - 0x87) {
    y.length = local_28;
    y.ptr = in_stack_ffffffffffffffd0->data;
    in_stack_ffffffffffffffc8 = local_28;
    bVar1 = large_mul<(unsigned_short)62>
                      ((stackvec<(unsigned_short)62> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),y);
    if (!bVar1) {
      return false;
    }
  }
  uVar2 = 0x1b;
  while( true ) {
    if (local_14 < uVar2) {
      if ((local_14 == 0) ||
         (bVar1 = small_mul<(unsigned_short)62>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
         , bVar1)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      return local_1;
    }
    bVar1 = small_mul<(unsigned_short)62>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    local_14 = local_14 - uVar2;
  }
  return false;
}

Assistant:

bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    static constexpr uint32_t large_step = 135;
    static constexpr uint64_t small_power_of_5[] = {
      1UL, 5UL, 25UL, 125UL, 625UL, 3125UL, 15625UL, 78125UL, 390625UL,
      1953125UL, 9765625UL, 48828125UL, 244140625UL, 1220703125UL,
      6103515625UL, 30517578125UL, 152587890625UL, 762939453125UL,
      3814697265625UL, 19073486328125UL, 95367431640625UL, 476837158203125UL,
      2384185791015625UL, 11920928955078125UL, 59604644775390625UL,
      298023223876953125UL, 1490116119384765625UL, 7450580596923828125UL,
    };
#ifdef FASTFLOAT_64BIT_LIMB
    constexpr static limb large_power_of_5[] = {
      1414648277510068013UL, 9180637584431281687UL, 4539964771860779200UL,
      10482974169319127550UL, 198276706040285095UL};
#else
    constexpr static limb large_power_of_5[] = {
      4279965485U, 329373468U, 4020270615U, 2137533757U, 4287402176U,
      1057042919U, 1071430142U, 2440757623U, 381945767U, 46164893U};
#endif
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      FASTFLOAT_TRY(small_mul(vec, limb(small_power_of_5[exp])));
    }

    return true;
  }